

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

bool __thiscall cinatra::uri_t::parse_from(uri_t *this,char *encoded)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *fragment_end;
  char *fragment_begin;
  char *query_end;
  char *query_begin;
  char *path_end;
  char *path_begin;
  char *uinfo_end;
  char *uinfo_begin;
  char *u_end;
  char *host_end;
  char *host_begin;
  char *port_begin;
  char *authority_end;
  char *authority_begin;
  char *scheme_end;
  char *scheme_begin;
  char *p2;
  bool is_relative_reference;
  char *p;
  int in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe91;
  undefined1 in_stack_fffffffffffffe92;
  undefined1 in_stack_fffffffffffffe93;
  undefined1 in_stack_fffffffffffffe94;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 uVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *local_138;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  char *local_110;
  char *local_108;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  size_t local_80;
  char *local_78;
  size_t local_60;
  char *local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  char *local_40;
  char *local_38;
  char *local_30;
  char local_21;
  char *local_20;
  bool local_1;
  
  local_21 = '\x01';
  local_30 = in_RSI;
  while( true ) {
    uVar4 = false;
    if (*local_30 != '/') {
      uVar4 = *local_30 != '\0';
    }
    if ((bool)uVar4 == false) goto LAB_00142e33;
    if (*local_30 == ':') break;
    local_30 = local_30 + 1;
  }
  local_21 = '\0';
LAB_00142e33:
  local_20 = in_RSI;
  if (local_21 == '\0') {
    iVar2 = isalpha((int)*in_RSI);
    if (iVar2 == 0) {
      local_1 = false;
    }
    else {
      local_38 = local_20;
      do {
        local_20 = local_20 + 1;
        if (*local_20 == ':') {
          local_40 = local_20;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_50,local_38,(long)local_20 - (long)local_38);
          in_RDI->_M_len = local_50._M_len;
          in_RDI->_M_str = local_50._M_str;
          local_60 = in_RDI->_M_len;
          local_58 = in_RDI->_M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffea0,(char *)in_RDI);
          __x._M_str = in_stack_fffffffffffffec0;
          __x._M_len = in_stack_fffffffffffffeb8;
          __y._M_str = in_stack_fffffffffffffeb0;
          __y._M_len = (size_t)in_stack_fffffffffffffea8;
          bVar1 = std::operator==(__x,__y);
          in_stack_fffffffffffffe96 = true;
          if (!bVar1) {
            local_80 = in_RDI->_M_len;
            local_78 = in_RDI->_M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffea0,(char *)in_RDI);
            __x_00._M_str = in_stack_fffffffffffffec0;
            __x_00._M_len = in_stack_fffffffffffffeb8;
            __y_00._M_str = in_stack_fffffffffffffeb0;
            __y_00._M_len = (size_t)in_stack_fffffffffffffea8;
            in_stack_fffffffffffffe96 = std::operator==(__x_00,__y_00);
          }
          *(undefined1 *)&in_RDI[7]._M_len = in_stack_fffffffffffffe96;
          local_20 = local_20 + 1;
          goto LAB_00142ffd;
        }
        bVar1 = is_scheme_character((uri_t *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe96,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                                    in_stack_fffffffffffffe8c);
      } while (bVar1);
      local_1 = false;
    }
  }
  else {
LAB_00142ffd:
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_RDI);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_98 = (char *)0x0;
      local_a0 = (char *)0x0;
      if ((*local_20 == '/') && (local_20[1] == '/')) {
        local_98 = local_20 + 2;
        local_20 = local_98;
        while( true ) {
          bVar1 = false;
          if (((*local_20 != '/') && (bVar1 = false, *local_20 != '?')) &&
             (bVar1 = false, *local_20 != '#')) {
            bVar1 = *local_20 != '\0';
          }
          if (bVar1 == false) {
            local_a0 = local_20;
            in_stack_fffffffffffffe95 = 0;
            pcVar3 = local_20;
            if (local_98 != local_20) {
              do {
                local_a8 = pcVar3 + -1;
                iVar2 = isdigit((int)*local_a8);
                in_stack_fffffffffffffe94 = iVar2 != 0 && local_a8 != local_98;
                pcVar3 = local_a8;
              } while (iVar2 != 0 && local_a8 != local_98);
              if (*local_a8 == ':') {
                local_b0 = local_98;
                local_b8 = local_a8;
                local_a8 = local_a8 + 1;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_c8,local_a8,(long)local_a0 - (long)local_a8);
                in_RDI[3]._M_len = local_c8._M_len;
                in_RDI[3]._M_str = local_c8._M_str;
              }
              else {
                local_b0 = local_98;
                local_b8 = local_a0;
              }
              local_d0 = local_b0;
              while( true ) {
                bVar1 = is_user_info_character
                                  ((uri_t *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe96,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                                   in_stack_fffffffffffffe8c);
                in_stack_fffffffffffffe93 = bVar1 && local_d0 != local_b8;
                if (!bVar1 || local_d0 == local_b8) break;
                local_d0 = local_d0 + 1;
              }
              if (*local_d0 == '@') {
                local_b0 = local_d0 + 1;
                local_d8 = local_98;
                local_e0 = local_d0;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_f0,local_98,(long)local_d0 - (long)local_98);
                in_RDI[1]._M_len = local_f0._M_len;
                in_RDI[1]._M_str = local_f0._M_str;
              }
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_100,local_b0,(long)local_b8 - (long)local_b0);
              in_RDI[2]._M_len = local_100._M_len;
              in_RDI[2]._M_str = local_100._M_str;
            }
            goto LAB_001433ab;
          }
          bVar1 = is_authority_character
                            ((uri_t *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe96,
                                                              CONCAT15(bVar1,CONCAT14(
                                                  in_stack_fffffffffffffe94,
                                                  CONCAT13(in_stack_fffffffffffffe93,
                                                           CONCAT12(in_stack_fffffffffffffe92,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),
                             in_stack_fffffffffffffe8c);
          if (!bVar1) break;
          local_20 = local_20 + 1;
        }
        local_1 = false;
      }
      else {
LAB_001433ab:
        if ((*local_20 == '/') ||
           (bVar1 = is_path_character((uri_t *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe96,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                                      in_stack_fffffffffffffe8c), bVar1)) {
          local_108 = local_20;
          while( true ) {
            in_stack_fffffffffffffe92 = false;
            if ((*local_20 != '?') && (in_stack_fffffffffffffe92 = false, *local_20 != '#')) {
              in_stack_fffffffffffffe92 = *local_20 != '\0';
            }
            if ((bool)in_stack_fffffffffffffe92 == false) {
              local_110 = local_20;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_120,local_108,(long)local_20 - (long)local_108);
              in_RDI[4]._M_len = local_120._M_len;
              in_RDI[4]._M_str = local_120._M_str;
              goto LAB_001434b2;
            }
            bVar1 = is_path_character((uri_t *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe96,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                                      in_stack_fffffffffffffe8c);
            if (!bVar1) break;
            local_20 = local_20 + 1;
          }
          local_1 = false;
        }
        else {
LAB_001434b2:
          if (*local_20 == '?') {
            pcVar3 = local_20 + 1;
            local_20 = pcVar3;
            while( true ) {
              in_stack_fffffffffffffe91 = false;
              if (*local_20 != '#') {
                in_stack_fffffffffffffe91 = *local_20 != '\0';
              }
              if ((bool)in_stack_fffffffffffffe91 == false) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xfffffffffffffec0,pcVar3,(long)local_20 - (long)pcVar3);
                in_RDI[5]._M_len = (size_t)in_stack_fffffffffffffec0;
                in_RDI[5]._M_str = local_138;
                goto LAB_0014359a;
              }
              bVar1 = is_query_character((uri_t *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe96,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                                         in_stack_fffffffffffffe8c);
              if (!bVar1) break;
              local_20 = local_20 + 1;
            }
            local_1 = false;
          }
          else {
LAB_0014359a:
            if (*local_20 == '#') {
              pcVar3 = local_20 + 1;
              for (local_20 = pcVar3; *local_20 != '\0'; local_20 = local_20 + 1) {
                bVar1 = is_fragment_character
                                  ((uri_t *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe96,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                                   in_stack_fffffffffffffe8c);
                if (!bVar1) {
                  return false;
                }
              }
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xfffffffffffffea0,pcVar3,(long)local_20 - (long)pcVar3);
              in_RDI[6]._M_len = (size_t)in_stack_fffffffffffffea0;
              in_RDI[6]._M_str = in_stack_fffffffffffffea8;
            }
            local_1 = true;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool parse_from(const char *encoded) {
    const char *p = encoded;

    // IMPORTANT -- A uri may either be an absolute uri, or an
    // relative-reference Absolute: 'http://host.com' Relative-Reference:
    // '//:host.com', '/path1/path2?query', './path1:path2' A Relative-Reference
    // can be disambiguated by parsing for a ':' before the first slash

    bool is_relative_reference = true;
    const char *p2 = p;
    for (; *p2 != ('/') && *p2 != ('\0'); p2++) {
      if (*p2 == (':')) {
        // found a colon, the first portion is a scheme
        is_relative_reference = false;
        break;
      }
    }

    if (!is_relative_reference) {
      // the first character of a scheme must be a letter
      if (!isalpha(*p)) {
        return false;
      }

      // start parsing the scheme, it's always delimited by a colon (must be
      // present)
      auto scheme_begin = p++;
      for (; *p != ':'; p++) {
        if (!is_scheme_character(*p)) {
          return false;
        }
      }
      auto scheme_end = p;
      schema = std::string_view(scheme_begin, scheme_end - scheme_begin);
      is_ssl = (schema == "https" || schema == "wss");

      // skip over the colon
      p++;
    }

    // the uri must have http or https
    if (schema.empty()) {
      return false;
    }

    // if we see two slashes next, then we're going to parse the authority
    // portion later on we'll break up the authority into the port and host
    const char *authority_begin = nullptr;
    const char *authority_end = nullptr;
    if (*p == ('/') && p[1] == ('/')) {
      // skip over the slashes
      p += 2;
      authority_begin = p;

      // the authority is delimited by a slash (resource), question-mark (query)
      // or octothorpe (fragment) or by EOS. The authority could be empty
      // ('file:///C:\file_name.txt')
      for (; *p != ('/') && *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        // We're NOT currently supporting IPvFuture or username/password in
        // authority IPv6 as the host (i.e. http://[:::::::]) is allowed as
        // valid URI and passed to subsystem for support.
        if (!is_authority_character(*p)) {
          return false;
        }
      }
      authority_end = p;

      // now lets see if we have a port specified -- by working back from the
      // end
      if (authority_begin != authority_end) {
        // the port is made up of all digits
        const char *port_begin = authority_end - 1;
        for (; isdigit(*port_begin) && port_begin != authority_begin;
             port_begin--) {
        }

        const char *host_begin = nullptr;
        const char *host_end = nullptr;
        if (*port_begin == (':')) {
          // has a port
          host_begin = authority_begin;
          host_end = port_begin;

          // skip the colon
          port_begin++;

          port = std::string_view(port_begin, authority_end - port_begin);
        }
        else {
          // no port
          host_begin = authority_begin;
          host_end = authority_end;
        }

        // look for a user_info component
        const char *u_end = host_begin;
        for (; is_user_info_character(*u_end) && u_end != host_end; u_end++) {
        }

        if (*u_end == ('@')) {
          host_begin = u_end + 1;
          auto uinfo_begin = authority_begin;
          auto uinfo_end = u_end;
          uinfo = std::string_view(uinfo_begin, uinfo_end - uinfo_begin);
        }
        host = std::string_view(host_begin, host_end - host_begin);
      }
    }

    // if we see a path character or a slash, then the
    // if we see a slash, or any other legal path character, parse the path next
    if (*p == ('/') || is_path_character(*p)) {
      auto path_begin = p;

      // the path is delimited by a question-mark (query) or octothorpe
      // (fragment) or by EOS
      for (; *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        if (!is_path_character(*p)) {
          return false;
        }
      }
      auto path_end = p;
      path = std::string_view(path_begin, path_end - path_begin);
    }

    // if we see a ?, then the query is next
    if (*p == ('?')) {
      // skip over the question mark
      p++;
      auto query_begin = p;

      // the query is delimited by a '#' (fragment) or EOS
      for (; *p != ('#') && *p != ('\0'); p++) {
        if (!is_query_character(*p)) {
          return false;
        }
      }
      auto query_end = p;
      query = std::string_view(query_begin, query_end - query_begin);
    }

    // if we see a #, then the fragment is next
    if (*p == ('#')) {
      // skip over the hash mark
      p++;
      auto fragment_begin = p;

      // the fragment is delimited by EOS
      for (; *p != ('\0'); p++) {
        if (!is_fragment_character(*p)) {
          return false;
        }
      }
      auto fragment_end = p;
      fragment =
          std::string_view(fragment_begin, fragment_end - fragment_begin);
    }

    return true;
  }